

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O1

int __thiscall MatroskaDemuxer::readTrackEncoding(MatroskaDemuxer *this,MatroskaTrack *track)

{
  int *levelUp;
  int iVar1;
  uint32_t uVar2;
  uint32_t id;
  uint32_t local_30;
  uint32_t local_2c;
  
  iVar1 = ebml_read_master(this,&local_30);
  if (-1 < iVar1) {
    if (iVar1 == 0) {
      levelUp = &this->level_up;
      do {
        iVar1 = ebml_read_element_id(this,&local_2c,levelUp);
        uVar2 = 0;
        if (-1 < iVar1) {
          uVar2 = local_2c;
        }
        if (uVar2 == 0) break;
        if (0 < *levelUp) {
          *levelUp = *levelUp + -1;
          break;
        }
        if (uVar2 == 0x5034) {
          iVar1 = readEncodingCompression(this,track);
        }
        else {
          iVar1 = ebml_read_skip(this);
        }
        if (*levelUp != 0) {
          *levelUp = *levelUp + -1;
          break;
        }
      } while (iVar1 == 0);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int MatroskaDemuxer::readTrackEncoding(MatroskaTrack *track)
{
    int res;
    uint32_t id;

    if ((res = ebml_read_master(&id)) < 0)
        return res;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            break;
        }
        if (level_up > 0)
        {
            level_up--;
            break;
        }

        res = id == MATROSKA_ID_ENCODINGCOMPRESSION ? readEncodingCompression(track) : ebml_read_skip();

        if (level_up)
        {
            level_up--;
            break;
        }
    }
    return 0;
}